

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

LogicProgram * __thiscall Clasp::Asp::LogicProgram::addProject(LogicProgram *this,AtomSpan *atoms)

{
  uint uVar1;
  VarVec *this_00;
  Aux *pAVar2;
  size_t sVar3;
  pointer puVar4;
  uint uVar5;
  uint local_14;
  Memcpy<unsigned_int> local_10;
  
  if ((this->super_ProgramBuilder).frozen_ != true) {
    pAVar2 = this->auxData_;
    this_00 = &pAVar2->project;
    sVar3 = atoms->size;
    uVar5 = (pAVar2->project).ebo_.size;
    if (sVar3 == 0) {
      if (uVar5 == 0) {
        local_14 = 0;
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_00,&local_14);
      }
    }
    else {
      puVar4 = (this_00->ebo_).buf;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar1 = uVar5 - 1;
        if (puVar4[uVar1] == 0) {
          (pAVar2->project).ebo_.size = uVar1;
          uVar5 = uVar1;
        }
      }
      local_10.first_ = atoms->first;
      bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::
      insert_impl<unsigned_int,bk_lib::detail::Memcpy<unsigned_int>>
                ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,puVar4 + uVar5,
                 (uint)sVar3,&local_10);
    }
    return this;
  }
  Potassco::fail(-2,"LogicProgram &Clasp::Asp::LogicProgram::addProject(const Potassco::AtomSpan &)"
                 ,0x28b,"!frozen()","Can\'t update frozen program!",0);
}

Assistant:

LogicProgram& LogicProgram::addProject(const Potassco::AtomSpan& atoms) {
	check_not_frozen();
	VarVec& pro = auxData_->project;
	if (!Potassco::empty(atoms)) {
		if (!pro.empty() && pro.back() == 0) { pro.pop_back(); }
		pro.insert(pro.end(), Potassco::begin(atoms), Potassco::end(atoms));
	}
	else if (pro.empty()) {
		pro.push_back(0);
	}
	return *this;
}